

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _treeIterator.hpp
# Opt level: O0

treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> * __thiscall
ft::treeIterator<int,_ft::allocator<ft::treeNode<int>_>_>::operator++
          (treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *this)

{
  treeNode<int> *ptVar1;
  treeNode<int> *local_18;
  treeNode<int> *prev;
  treeIterator<int,_ft::allocator<ft::treeNode<int>_>_> *this_local;
  
  ptVar1 = node(this);
  if (ptVar1->right == this->m_tree->NIL) {
    local_18 = node(this);
    ptVar1 = node(this);
    this->m_node = ptVar1->parent;
    while (ptVar1 = node(this), ptVar1->right == local_18) {
      local_18 = node(this);
      ptVar1 = node(this);
      this->m_node = ptVar1->parent;
    }
  }
  else {
    ptVar1 = node(this);
    this->m_node = ptVar1->right;
    ptVar1 = node(this);
    ptVar1 = leftEnd(this,ptVar1);
    this->m_node = ptVar1;
  }
  return this;
}

Assistant:

treeIterator&	operator++()
	{
		if (this->node()->right != this->m_tree->NIL) {
			this->m_node = this->node()->right;
			this->m_node = this->leftEnd(this->node());
		} else {
			treeNode<value_type>*	prev = this->node();
			this->m_node = this->node()->parent;
			while (this->node()->right == prev)
			{
				prev = this->node();
				this->m_node = this->node()->parent;
			}
		}
		return *this;
	}